

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::Base64EscapeInternal
               (uchar *src,int szsrc,string *dest,bool do_padding,char *base64_chars)

{
  int szsrc_00;
  uchar *src_00;
  int szdest;
  char *dest_00;
  LogMessage *other;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  int local_38;
  int local_34;
  int escaped_len;
  int calc_escaped_size;
  char *base64_chars_local;
  string *psStack_20;
  bool do_padding_local;
  string *dest_local;
  uchar *puStack_10;
  int szsrc_local;
  uchar *src_local;
  
  _escaped_len = base64_chars;
  base64_chars_local._7_1_ = do_padding;
  psStack_20 = dest;
  dest_local._4_4_ = szsrc;
  puStack_10 = src;
  local_34 = CalculateBase64EscapedLen(szsrc,do_padding);
  std::__cxx11::string::resize((ulong)psStack_20);
  src_00 = puStack_10;
  szsrc_00 = dest_local._4_4_;
  dest_00 = string_as_array(psStack_20);
  szdest = std::__cxx11::string::size();
  local_38 = Base64EscapeInternal
                       (src_00,szsrc_00,dest_00,szdest,_escaped_len,
                        (bool)(base64_chars_local._7_1_ & 1));
  local_71 = 0;
  if (local_34 != local_38) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x8a7);
    local_71 = 1;
    other = internal::LogMessage::operator<<
                      (&local_70,"CHECK failed: (calc_escaped_size) == (escaped_len): ");
    internal::LogFinisher::operator=(local_85,other);
  }
  if ((local_71 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_70);
  }
  std::__cxx11::string::erase((ulong)psStack_20,(long)local_38);
  return;
}

Assistant:

void Base64EscapeInternal(const unsigned char *src, int szsrc,
                          std::string *dest, bool do_padding,
                          const char *base64_chars) {
  const int calc_escaped_size =
    CalculateBase64EscapedLen(szsrc, do_padding);
  dest->resize(calc_escaped_size);
  const int escaped_len = Base64EscapeInternal(src, szsrc,
                                               string_as_array(dest),
                                               dest->size(),
                                               base64_chars,
                                               do_padding);
  GOOGLE_DCHECK_EQ(calc_escaped_size, escaped_len);
  dest->erase(escaped_len);
}